

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O3

size_t svb_encode(uint8_t *out,uint32_t *in,uint32_t count,int delta,int type)

{
  uint8_t *puVar1;
  
  *(uint32_t *)out = count;
  if (type == 1 && delta == 0) {
    puVar1 = svb_encode_scalar(in,out + 4,out + (ulong)(count + 3 >> 2) + 4,count);
  }
  else {
    if ((delta != 1) || (type != 1)) {
      printf("Unknown delta (%d) type (%d) combination.\n",(ulong)(uint)delta,type);
      abort();
    }
    puVar1 = svb_encode_scalar_d1_init(in,out + 4,out + (ulong)(count + 3 >> 2) + 4,count,0);
  }
  return (long)puVar1 - (long)out;
}

Assistant:

size_t svb_encode(uint8_t *out, const uint32_t *in, uint32_t count, int delta,
                    int type) {
  *(uint32_t *)out = count;          // first 4 bytes is number of ints
  uint8_t *keyPtr = out + 4;         // keys come immediately after 32-bit count
  uint32_t keyLen = (count + 3) / 4; // 2-bits rounded to full byte
  uint8_t *dataPtr = keyPtr + keyLen; // variable byte data after all keys

  if (delta == 0 && type == 1) {
    return svb_encode_scalar(in, keyPtr, dataPtr, count) - out;
  }

  if (delta == 1 && type == 1) {
    return svb_encode_scalar_d1(in, keyPtr, dataPtr, count) - out;
  }

  printf("Unknown delta (%d) type (%d) combination.\n", delta, type);
  abort();
}